

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool Curl_conn_seems_dead(connectdata *conn,Curl_easy *data,curltime *pnow)

{
  undefined8 uVar1;
  undefined4 uVar2;
  _Bool _Var3;
  size_t sVar4;
  curltime cVar5;
  _Bool local_55;
  uint local_54;
  _Bool input_pending;
  time_t tStack_50;
  uint state;
  int local_48;
  undefined4 uStack_44;
  undefined1 local_40 [8];
  curltime now;
  curltime *pcStack_28;
  _Bool dead;
  curltime *pnow_local;
  Curl_easy *data_local;
  connectdata *conn_local;
  
  sVar4 = Curl_llist_count(&conn->easyq);
  if (sVar4 == 0) {
    pcStack_28 = pnow;
    if (pnow == (curltime *)0x0) {
      cVar5 = Curl_now();
      tStack_50 = cVar5.tv_sec;
      local_48 = cVar5.tv_usec;
      now.tv_sec = CONCAT44(uStack_44,local_48);
      pcStack_28 = (curltime *)local_40;
      local_40 = (undefined1  [8])tStack_50;
    }
    uVar1 = pcStack_28->tv_sec;
    uVar2 = pcStack_28->tv_usec;
    cVar5.tv_usec = uVar2;
    cVar5.tv_sec = uVar1;
    cVar5._12_4_ = 0;
    _Var3 = conn_maxage(data,conn,cVar5);
    if (_Var3) {
      now._15_1_ = 1;
    }
    else if (conn->handler->connection_check == (_func_uint_Curl_easy_ptr_connectdata_ptr_uint *)0x0
            ) {
      local_55 = false;
      Curl_attach_connection(data,conn);
      _Var3 = Curl_conn_is_alive(data,conn,&local_55);
      now._15_1_ = (_Var3 ^ 0xffU) & 1;
      if ((local_55 & 1U) != 0) {
        now._15_1_ = 1;
      }
      Curl_detach_connection(data);
    }
    else {
      Curl_attach_connection(data,conn);
      local_54 = (*conn->handler->connection_check)(data,conn,1);
      now._15_1_ = (local_54 & 1) != 0;
      Curl_detach_connection(data);
    }
    if ((now._15_1_ & 1) != 0) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"Connection %ld seems to be dead",conn->connection_id);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Curl_conn_seems_dead(struct connectdata *conn,
                          struct Curl_easy *data,
                          struct curltime *pnow)
{
  DEBUGASSERT(!data->conn);
  if(!CONN_INUSE(conn)) {
    /* The check for a dead socket makes sense only if the connection is not in
       use */
    bool dead;
    struct curltime now;
    if(!pnow) {
      now = Curl_now();
      pnow = &now;
    }

    if(conn_maxage(data, conn, *pnow)) {
      /* avoid check if already too old */
      dead = TRUE;
    }
    else if(conn->handler->connection_check) {
      /* The protocol has a special method for checking the state of the
         connection. Use it to check if the connection is dead. */
      unsigned int state;

      /* briefly attach the connection to this transfer for the purpose of
         checking it */
      Curl_attach_connection(data, conn);

      state = conn->handler->connection_check(data, conn, CONNCHECK_ISDEAD);
      dead = (state & CONNRESULT_DEAD);
      /* detach the connection again */
      Curl_detach_connection(data);

    }
    else {
      bool input_pending = FALSE;

      Curl_attach_connection(data, conn);
      dead = !Curl_conn_is_alive(data, conn, &input_pending);
      if(input_pending) {
        /* For reuse, we want a "clean" connection state. The includes
         * that we expect - in general - no waiting input data. Input
         * waiting might be a TLS Notify Close, for example. We reject
         * that.
         * For protocols where data from other end may arrive at
         * any time (HTTP/2 PING for example), the protocol handler needs
         * to install its own `connection_check` callback.
         */
        DEBUGF(infof(data, "connection has input pending, not reusable"));
        dead = TRUE;
      }
      Curl_detach_connection(data);
    }

    if(dead) {
      /* remove connection from cpool */
      infof(data, "Connection %" FMT_OFF_T " seems to be dead",
            conn->connection_id);
      return TRUE;
    }
  }
  return FALSE;
}